

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

StringView __thiscall
anon_unknown.dwarf_426d84::SpecialSubstitution::getBaseName(SpecialSubstitution *this)

{
  StringView SVar1;
  SpecialSubstitution *this_local;
  
  SVar1 = (StringView)
          (*(code *)(&DAT_0038edbc +
                    *(int *)(&DAT_0038edbc + (ulong)*(uint *)&(this->super_Node).field_0xc * 4)))();
  return SVar1;
}

Assistant:

StringView getBaseName() const override {
    switch (SSK) {
    case SpecialSubKind::allocator:
      return StringView("allocator");
    case SpecialSubKind::basic_string:
      return StringView("basic_string");
    case SpecialSubKind::string:
      return StringView("string");
    case SpecialSubKind::istream:
      return StringView("istream");
    case SpecialSubKind::ostream:
      return StringView("ostream");
    case SpecialSubKind::iostream:
      return StringView("iostream");
    }
    LLVM_BUILTIN_UNREACHABLE;
  }